

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-interp.cc
# Opt level: O2

void __thiscall
InterpTest::ReadModule(InterpTest *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *data)

{
  pointer data_00;
  char *message;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  Result result;
  AssertionResult gtest_ar;
  Errors errors;
  AssertHelper local_98;
  string local_90;
  string local_70;
  Color local_50;
  ReadBinaryOptions options;
  
  errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  errors.super__Vector_base<wabt::Error,_std::allocator<wabt::Error>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  wabt::ReadBinaryOptions::ReadBinaryOptions(&options);
  data_00 = (data->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_start;
  result = wabt::interp::ReadBinaryInterp
                     (data_00,(long)(data->
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)data_00,
                      &options,&errors,&this->module_desc_);
  local_70._M_dataplus._M_p._0_4_ = 0;
  testing::internal::CmpHelperEQ<wabt::Result::Enum,wabt::Result>
            ((internal *)&gtest_ar,"Result::Ok","result",(Enum *)&local_70,&result);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_d8);
    wabt::Color::Color(&local_50,(FILE *)0x0,false);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    local_90._M_string_length = 0;
    local_90.field_2._M_local_buf[0] = '\0';
    wabt::FormatErrorsToString
              (&local_70,&errors,Binary,(LexerSourceLineFinder *)0x0,&local_50,&local_90,Never,0x50)
    ;
    std::operator<<((ostream *)(local_d8.ptr_ + 0x10),(string *)&local_70);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-interp.cc"
               ,0x23,message);
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_d8);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_d8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::vector<wabt::Error,_std::allocator<wabt::Error>_>::~vector(&errors);
  return;
}

Assistant:

void ReadModule(const std::vector<u8>& data) {
    Errors errors;
    ReadBinaryOptions options;
    Result result = ReadBinaryInterp(data.data(), data.size(), options, &errors,
                                     &module_desc_);
    ASSERT_EQ(Result::Ok, result)
        << FormatErrorsToString(errors, Location::Type::Binary);
  }